

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_doomweaps.cpp
# Opt level: O3

int AF_A_FirePistol(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  AWeapon *this;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  void *pvVar5;
  FState *state;
  PClass *pPVar6;
  PClassActor *pufftype;
  player_t *ppVar7;
  uint uVar8;
  AActor *ent;
  VMValue *pVVar9;
  char *__assertion;
  bool bVar10;
  bool bVar11;
  FSoundID local_3c;
  FName local_38;
  FName local_34;
  
  pPVar6 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005bbb51;
  }
  if ((param->field_0).field_3.Type != '\x03') goto LAB_005bbb41;
  ent = (AActor *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (ent == (AActor *)0x0) goto LAB_005bb95b;
    pPVar4 = (ent->super_DThinker).super_DObject.Class;
    if (pPVar4 == (PClass *)0x0) {
      iVar3 = (**(ent->super_DThinker).super_DObject._vptr_DObject)(ent);
      pPVar4 = (PClass *)CONCAT44(extraout_var,iVar3);
      (ent->super_DThinker).super_DObject.Class = pPVar4;
    }
    bVar10 = pPVar4 == (PClass *)0x0;
    ret = (VMReturn *)(ulong)!bVar10;
    bVar11 = pPVar4 == pPVar6;
    if (!bVar11 && !bVar10) {
      do {
        pPVar4 = pPVar4->ParentClass;
        ret = (VMReturn *)(ulong)(pPVar4 != (PClass *)0x0);
        if (pPVar4 == pPVar6) break;
      } while (pPVar4 != (PClass *)0x0);
    }
    pVVar9 = (VMValue *)(ulong)(bVar11 || bVar10);
    uVar8 = (uint)bVar10;
    if ((char)ret == '\0') {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_005bbb51;
    }
  }
  else {
    if (ent != (AActor *)0x0) goto LAB_005bbb41;
LAB_005bb95b:
    ent = (AActor *)0x0;
    pVVar9 = param;
    uVar8 = numparam;
  }
  pPVar6 = AActor::RegistrationInfo.MyClass;
  if (numparam != 1) {
    VVar1 = param[1].field_0.field_3.Type;
    if (VVar1 != 0xff) {
      if (VVar1 != '\x03') {
LAB_005bbb41:
        __assertion = 
        "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
        ;
        goto LAB_005bbb51;
      }
      puVar2 = (undefined8 *)param[1].field_0.field_1.a;
      if (param[1].field_0.field_1.atag == 1) {
        if (puVar2 != (undefined8 *)0x0) {
          pPVar4 = (PClass *)puVar2[1];
          if (pPVar4 == (PClass *)0x0) {
            pPVar4 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar9,uVar8,ret);
            puVar2[1] = pPVar4;
          }
          bVar10 = pPVar4 != (PClass *)0x0;
          if (pPVar4 != pPVar6 && bVar10) {
            do {
              pPVar4 = pPVar4->ParentClass;
              bVar10 = pPVar4 != (PClass *)0x0;
              if (pPVar4 == pPVar6) break;
            } while (pPVar4 != (PClass *)0x0);
          }
          if (!bVar10) {
            __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
            goto LAB_005bbb51;
          }
        }
      }
      else if (puVar2 != (undefined8 *)0x0) goto LAB_005bbb41;
    }
    if ((2 < numparam) && (VVar1 = param[2].field_0.field_3.Type, VVar1 != 0xff)) {
      if (VVar1 == '\x03') {
        pvVar5 = param[2].field_0.field_1.a;
        if (param[2].field_0.field_1.atag == 8) goto LAB_005bba1f;
        if (pvVar5 == (void *)0x0) goto LAB_005bba1d;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
LAB_005bbb51:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_doom/a_doomweaps.cpp"
                    ,0x48,"int AF_A_FirePistol(VMFrameStack *, VMValue *, int, VMReturn *, int)");
    }
  }
LAB_005bba1d:
  pvVar5 = (void *)0x0;
LAB_005bba1f:
  ppVar7 = ent->player;
  if (ppVar7 == (player_t *)0x0) {
    bVar10 = true;
  }
  else {
    this = ppVar7->ReadyWeapon;
    if ((pvVar5 != (void *)0x0 && this != (AWeapon *)0x0) && (*(int *)((long)pvVar5 + 8) == 1)) {
      bVar10 = AWeapon::DepleteAmmo(this,this->bAltFire,true,1);
      if (!bVar10) {
        return 0;
      }
      ppVar7 = ent->player;
      local_38.Index = 0xa3;
      state = AActor::FindState((AActor *)this,&local_38);
      P_SetPsprite(ppVar7,PSP_FLASH,state,true);
      ppVar7 = ent->player;
    }
    APlayerPawn::PlayAttacking2(ppVar7->mo);
    bVar10 = ent->player->refire == 0;
  }
  local_3c.ID = S_FindSound("weapons/pistol");
  S_Sound(ent,1,&local_3c,1.0,1.0);
  local_34.Index = 0x40;
  pPVar6 = PClass::FindClass(&local_34);
  pufftype = dyn_cast<PClassActor>((DObject *)pPVar6);
  P_BulletSlope((AActor *)&stack0xffffffffffffffd0,(FTranslatedLineTarget *)ent,0);
  P_GunShot(ent,bVar10,pufftype,(DAngle *)&stack0xffffffffffffffd0);
  return 0;
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FirePistol)
{
	PARAM_ACTION_PROLOGUE;

	bool accurate;

	if (self->player != nullptr)
	{
		AWeapon *weapon = self->player->ReadyWeapon;
		if (weapon != nullptr && ACTION_CALL_FROM_PSPRITE())
		{
			if (!weapon->DepleteAmmo (weapon->bAltFire, true, 1))
				return 0;

			P_SetPsprite(self->player, PSP_FLASH, weapon->FindState(NAME_Flash), true);
		}
		self->player->mo->PlayAttacking2 ();

		accurate = !self->player->refire;
	}
	else
	{
		accurate = true;
	}

	S_Sound (self, CHAN_WEAPON, "weapons/pistol", 1, ATTN_NORM);

	P_GunShot (self, accurate, PClass::FindActor(NAME_BulletPuff), P_BulletSlope (self));
	return 0;
}